

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * cmFileAPI::ReportCapabilities(void)

{
  Value *pVVar1;
  char *pcVar2;
  Value *in_RDI;
  Value local_2f8;
  Value local_2d0;
  Value *local_2a8;
  Value *versions_3;
  undefined1 local_278 [8];
  Value request_3;
  Value local_228;
  Value *local_200;
  Value *versions_2;
  undefined1 local_1d0 [8];
  Value request_2;
  Value local_180;
  Value *local_158;
  Value *versions_1;
  undefined1 local_128 [8];
  Value request_1;
  Value local_d8;
  Value *local_b0;
  Value *versions;
  undefined1 local_80 [8];
  Value request;
  Value local_48;
  Value *local_20;
  Value *requests;
  Value *capabilities;
  
  requests._7_1_ = 0;
  Json::Value::Value(in_RDI,objectValue);
  Json::Value::Value(&local_48,arrayValue);
  pVVar1 = Json::Value::operator[](in_RDI,"requests");
  pVVar1 = Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  local_20 = pVVar1;
  Json::Value::Value((Value *)local_80,objectValue);
  pcVar2 = ObjectKindName(CodeModel);
  Json::Value::Value((Value *)&versions,pcVar2);
  pVVar1 = Json::Value::operator[]((Value *)local_80,"kind");
  Json::Value::operator=(pVVar1,(Value *)&versions);
  Json::Value::~Value((Value *)&versions);
  Json::Value::Value(&local_d8,arrayValue);
  pVVar1 = Json::Value::operator[]((Value *)local_80,"version");
  pVVar1 = Json::Value::operator=(pVVar1,&local_d8);
  Json::Value::~Value(&local_d8);
  local_b0 = pVVar1;
  BuildVersion((Value *)&request_1.limit_,2,4);
  Json::Value::append(pVVar1,(Value *)&request_1.limit_);
  Json::Value::~Value((Value *)&request_1.limit_);
  Json::Value::append(local_20,(Value *)local_80);
  Json::Value::~Value((Value *)local_80);
  Json::Value::Value((Value *)local_128,objectValue);
  pcVar2 = ObjectKindName(Cache);
  Json::Value::Value((Value *)&versions_1,pcVar2);
  pVVar1 = Json::Value::operator[]((Value *)local_128,"kind");
  Json::Value::operator=(pVVar1,(Value *)&versions_1);
  Json::Value::~Value((Value *)&versions_1);
  Json::Value::Value(&local_180,arrayValue);
  pVVar1 = Json::Value::operator[]((Value *)local_128,"version");
  pVVar1 = Json::Value::operator=(pVVar1,&local_180);
  Json::Value::~Value(&local_180);
  local_158 = pVVar1;
  BuildVersion((Value *)&request_2.limit_,2,0);
  Json::Value::append(pVVar1,(Value *)&request_2.limit_);
  Json::Value::~Value((Value *)&request_2.limit_);
  Json::Value::append(local_20,(Value *)local_128);
  Json::Value::~Value((Value *)local_128);
  Json::Value::Value((Value *)local_1d0,objectValue);
  pcVar2 = ObjectKindName(CMakeFiles);
  Json::Value::Value((Value *)&versions_2,pcVar2);
  pVVar1 = Json::Value::operator[]((Value *)local_1d0,"kind");
  Json::Value::operator=(pVVar1,(Value *)&versions_2);
  Json::Value::~Value((Value *)&versions_2);
  Json::Value::Value(&local_228,arrayValue);
  pVVar1 = Json::Value::operator[]((Value *)local_1d0,"version");
  pVVar1 = Json::Value::operator=(pVVar1,&local_228);
  Json::Value::~Value(&local_228);
  local_200 = pVVar1;
  BuildVersion((Value *)&request_3.limit_,1,0);
  Json::Value::append(pVVar1,(Value *)&request_3.limit_);
  Json::Value::~Value((Value *)&request_3.limit_);
  Json::Value::append(local_20,(Value *)local_1d0);
  Json::Value::~Value((Value *)local_1d0);
  Json::Value::Value((Value *)local_278,objectValue);
  pcVar2 = ObjectKindName(Toolchains);
  Json::Value::Value((Value *)&versions_3,pcVar2);
  pVVar1 = Json::Value::operator[]((Value *)local_278,"kind");
  Json::Value::operator=(pVVar1,(Value *)&versions_3);
  Json::Value::~Value((Value *)&versions_3);
  Json::Value::Value(&local_2d0,arrayValue);
  pVVar1 = Json::Value::operator[]((Value *)local_278,"version");
  pVVar1 = Json::Value::operator=(pVVar1,&local_2d0);
  Json::Value::~Value(&local_2d0);
  local_2a8 = pVVar1;
  BuildVersion(&local_2f8,1,0);
  Json::Value::append(pVVar1,&local_2f8);
  Json::Value::~Value(&local_2f8);
  Json::Value::append(local_20,(Value *)local_278);
  Json::Value::~Value((Value *)local_278);
  return in_RDI;
}

Assistant:

Json::Value cmFileAPI::ReportCapabilities()
{
  Json::Value capabilities = Json::objectValue;
  Json::Value& requests = capabilities["requests"] = Json::arrayValue;

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::CodeModel);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(2, CodeModelV2Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::Cache);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(2, CacheV2Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::CMakeFiles);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(1, CMakeFilesV1Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::Toolchains);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(1, ToolchainsV1Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  return capabilities;
}